

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
CreateBCGeoBlendEl(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
                   *this,int side,int bc,TPZVec<int> *mapside)

{
  int iVar1;
  MElementType MVar2;
  long lVar3;
  int *piVar4;
  long *plVar5;
  TPZGeoMesh *pTVar6;
  TPZManVector<long,_10> *this_00;
  TPZVec<int> *in_RCX;
  uint in_EDX;
  int in_ESI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide newelside;
  TPZGeoElSide me;
  TPZGeoEl *newel;
  MElementType BCtype;
  TPZGeoMesh *mesh;
  int64_t index;
  int inode;
  TPZManVector<long,_10> nodeindices;
  int sidennodes;
  undefined8 in_stack_fffffffffffffec0;
  int side_00;
  TPZManVector<long,_10> *this_01;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  TPZManVector<long,_10> *this_02;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  TPZManVector<long,_10> *in_stack_fffffffffffffee0;
  undefined1 local_b0 [28];
  int local_94;
  TPZVec<long> local_90 [2];
  TPZVec<int> *in_stack_ffffffffffffffc0;
  TPZGeoElSide *in_stack_ffffffffffffffc8;
  TPZGeoElSide *in_stack_ffffffffffffffd0;
  undefined4 extraout_var;
  
  iVar1 = pztopology::TPZTriangle::NSideNodes(in_ESI);
  TPZManVector<long,_10>::TPZManVector
            (in_stack_fffffffffffffee0,CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
            );
  for (local_94 = 0; side_00 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20), local_94 < iVar1;
      local_94 = local_94 + 1) {
    lVar3 = (**(code **)(*(long *)in_RDI + 0x128))(in_RDI,in_ESI,local_94);
    piVar4 = TPZVec<int>::operator[](in_RCX,(long)local_94);
    plVar5 = TPZVec<long>::operator[](local_90,(long)*piVar4);
    *plVar5 = lVar3;
  }
  pTVar6 = TPZGeoEl::Mesh(in_RDI);
  MVar2 = pztopology::TPZTriangle::Type(in_ESI);
  iVar1 = (*(pTVar6->super_TPZSavable)._vptr_TPZSavable[0xd])
                    (pTVar6,(ulong)MVar2,local_90,(ulong)in_EDX,local_b0);
  this_00 = (TPZManVector<long,_10> *)CONCAT44(extraout_var,iVar1);
  this_02 = this_00;
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)this_00,
             (TPZGeoEl *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),side_00);
  this_01 = this_00;
  iVar1 = (*(this_00->super_TPZVec<long>)._vptr_TPZVec[0x1e])();
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)this_02,(TPZGeoEl *)CONCAT44(iVar1,in_stack_fffffffffffffec8),
             (int)((ulong)this_01 >> 0x20));
  TPZGeoElSide::InsertConnectivity
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  (*(this_00->super_TPZVec<long>)._vptr_TPZVec[0xf])();
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x17df941);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x17df94b);
  TPZManVector<long,_10>::~TPZManVector(this_01);
  return (TPZGeoEl *)this_00;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc, const TPZVec<int> &mapside)
{
    int sidennodes = TGeo::NSideNodes(side);
    TPZManVector<int64_t> nodeindices(sidennodes);
    int inode;
    for(inode=0; inode<sidennodes; inode++){
        nodeindices[mapside[inode]] = this->SideNodeIndex(side,inode);
    }
    int64_t index;
    
    TPZGeoMesh *mesh = this->Mesh();
    MElementType BCtype = TGeo::Type(side);
    
    TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
    TPZGeoElSide me(this,side);
    TPZGeoElSide newelside(newel,newel->NSides()-1);
    
    newelside.InsertConnectivity(me,mapside);
    newel->Initialize();
    
    return newel;
}